

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
defyx::AssemblyGeneratorX86::generateProgram(AssemblyGeneratorX86 *this,Program *prog)

{
  long lVar1;
  ostream *poVar2;
  Instruction *instr;
  uint i;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  for (lVar1 = 0x62; lVar1 != 0x6a; lVar1 = lVar1 + 1) {
    *(undefined4 *)(&this->asmCode + lVar1 * 4) = 0xffffffff;
  }
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  std::__cxx11::stringbuf::str((string *)&this->field_0x18);
  std::__cxx11::string::~string((string *)&local_50);
  instr = prog->programBuffer;
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    poVar2 = std::operator<<((ostream *)&this->field_0x10,"defyx_isn_");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,":");
    std::endl<char,std::char_traits<char>>(poVar2);
    instr->src = instr->src & 7;
    instr->dst = instr->dst & 7;
    generateCode(this,instr,(int)lVar1);
    instr = instr + 1;
  }
  return;
}

Assistant:

void AssemblyGeneratorX86::generateProgram(Program& prog) {
		for (unsigned i = 0; i < RegistersCount; ++i) {
			registerUsage[i] = -1;
		}
		asmCode.str(std::string()); //clear
		for (unsigned i = 0; i < prog.getSize(); ++i) {
			asmCode << "defyx_isn_" << i << ":" << std::endl;
			Instruction& instr = prog(i);
			instr.src %= RegistersCount;
			instr.dst %= RegistersCount;
			generateCode(instr, i);
		}
	}